

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O0

Gia_Man_t * Acec_InsertBox(Acec_Box_t *pBox,int fAll)

{
  Gia_Man_t *p_00;
  int iVar1;
  int v;
  uint uVar2;
  Gia_Man_t *p_01;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  int local_7c;
  int iLitNew;
  int iLit;
  int k;
  int i;
  Vec_Int_t *vTemp;
  Vec_Int_t *vLevel;
  Vec_Int_t *vRootRanks;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p;
  int fAll_local;
  Acec_Box_t *pBox_local;
  
  p_00 = pBox->pGia;
  iVar1 = Gia_ManObjNum(p_00);
  p_01 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p_00->pName);
  p_01->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p_00->pSpec);
  p_01->pSpec = pcVar3;
  Gia_ManFillValue(p_00);
  pGVar4 = Gia_ManConst0(p_00);
  pGVar4->Value = 0;
  iLit = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00->vCis);
    bVar6 = false;
    if (iLit < iVar1) {
      vRootRanks = (Vec_Int_t *)Gia_ManCi(p_00,iLit);
      bVar6 = vRootRanks != (Vec_Int_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ManAppendCi(p_01);
    *(int *)&vRootRanks->pArray = iVar1;
    iLit = iLit + 1;
  }
  if (fAll == 0) {
    if (pBox->vShared == (Vec_Wec_t *)0x0) {
      __assert_fail("pBox->vShared != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                    ,0xaf,"Gia_Man_t *Acec_InsertBox(Acec_Box_t *, int)");
    }
    if (pBox->vUnique == (Vec_Wec_t *)0x0) {
      __assert_fail("pBox->vUnique != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                    ,0xb0,"Gia_Man_t *Acec_InsertBox(Acec_Box_t *, int)");
    }
    pVVar5 = Acec_BuildTree(p_01,p_00,pBox->vShared,(Vec_Int_t *)0x0);
    vLevel = Acec_BuildTree(p_01,p_00,pBox->vUnique,pVVar5);
    Vec_IntFree(pVVar5);
  }
  else {
    vLevel = Acec_BuildTree(p_01,p_00,pBox->vLeafLits,(Vec_Int_t *)0x0);
  }
  for (iLit = 0; iVar1 = Vec_WecSize(pBox->vRootLits), iLit < iVar1; iLit = iLit + 1) {
    pVVar5 = Vec_WecEntry(pBox->vRootLits,iLit);
    for (iLitNew = 0; iVar1 = Vec_IntSize(pVVar5), iLitNew < iVar1; iLitNew = iLitNew + 1) {
      iVar1 = Vec_IntEntry(pVVar5,iLitNew);
      v = Abc_Lit2Var(iVar1);
      vRootRanks = (Vec_Int_t *)Gia_ManObj(p_00,v);
      if (iLitNew == 0) {
        local_7c = Vec_IntEntry(vLevel,iLit);
      }
      else {
        local_7c = 0;
      }
      iVar1 = Abc_LitIsCompl(iVar1);
      uVar2 = Abc_LitNotCond(local_7c,iVar1);
      *(uint *)&vRootRanks->pArray = uVar2;
    }
  }
  Vec_IntFree(vLevel);
  iLit = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00->vCos);
    bVar6 = false;
    if (iLit < iVar1) {
      vRootRanks = (Vec_Int_t *)Gia_ManCo(p_00,iLit);
      bVar6 = vRootRanks != (Vec_Int_t *)0x0;
    }
    if (!bVar6) break;
    pGVar4 = Gia_ObjFanin0((Gia_Obj_t *)vRootRanks);
    Acec_InsertBox_rec(p_01,p_00,pGVar4);
    iLit = iLit + 1;
  }
  iLit = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00->vCos);
    bVar6 = false;
    if (iLit < iVar1) {
      vRootRanks = (Vec_Int_t *)Gia_ManCo(p_00,iLit);
      bVar6 = vRootRanks != (Vec_Int_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)vRootRanks);
    iVar1 = Gia_ManAppendCo(p_01,iVar1);
    *(int *)&vRootRanks->pArray = iVar1;
    iLit = iLit + 1;
  }
  iVar1 = Gia_ManRegNum(p_00);
  Gia_ManSetRegNum(p_01,iVar1);
  return p_01;
}

Assistant:

Gia_Man_t * Acec_InsertBox( Acec_Box_t * pBox, int fAll )
{
    Gia_Man_t * p = pBox->pGia;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vRootRanks, * vLevel, * vTemp;
    int i, k, iLit, iLitNew;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // implement tree
    if ( fAll )
        vRootRanks = Acec_BuildTree( pNew, p, pBox->vLeafLits, NULL );
    else
    {
        assert( pBox->vShared != NULL );
        assert( pBox->vUnique != NULL );
        vRootRanks = Acec_BuildTree( pNew, p, pBox->vShared, NULL );
        vRootRanks = Acec_BuildTree( pNew, p, pBox->vUnique, vTemp = vRootRanks );
        Vec_IntFree( vTemp );
    }
    // update polarity of literals
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
            iLitNew = k ? 0 : Vec_IntEntry( vRootRanks, i );
            pObj->Value = Abc_LitNotCond( iLitNew, Abc_LitIsCompl(iLit) );
        }
    Vec_IntFree( vRootRanks );
    // construct the outputs
    Gia_ManForEachCo( p, pObj, i )
        Acec_InsertBox_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}